

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

size_t sysbvm_dwarf_encodeStringTupleWithDefaultString
                 (sysbvm_dynarray_t *buffer,sysbvm_tuple_t stringTuple,char *defaultString)

{
  size_t sVar1;
  _Bool _Var2;
  size_t sVar3;
  size_t offset;
  char *defaultString_local;
  sysbvm_tuple_t stringTuple_local;
  sysbvm_dynarray_t *buffer_local;
  
  sVar1 = buffer->size;
  _Var2 = sysbvm_tuple_isBytes(stringTuple);
  if ((_Var2) && (sVar3 = sysbvm_tuple_getSizeInBytes(stringTuple), sVar3 != 0)) {
    sVar3 = sysbvm_tuple_getSizeInBytes(stringTuple);
    sysbvm_dynarray_addAll(buffer,sVar3,(void *)(stringTuple + 0x10));
    sysbvm_dwarf_encodeByte(buffer,'\0');
  }
  else {
    sysbvm_dwarf_encodeCString(buffer,defaultString);
  }
  return sVar1;
}

Assistant:

SYSBVM_API size_t sysbvm_dwarf_encodeStringTupleWithDefaultString(sysbvm_dynarray_t *buffer, sysbvm_tuple_t stringTuple, const char *defaultString)
{
    size_t offset = buffer->size;
    if(sysbvm_tuple_isBytes(stringTuple) && sysbvm_tuple_getSizeInBytes(stringTuple) > 0)
    {
        sysbvm_dynarray_addAll(buffer, sysbvm_tuple_getSizeInBytes(stringTuple), SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(stringTuple)->bytes);
        sysbvm_dwarf_encodeByte(buffer, 0);
    }
    else
    {
        sysbvm_dwarf_encodeCString(buffer, defaultString);
    }

    return offset;
}